

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapimpl.cpp
# Opt level: O0

int32_t ucase_swap(UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  void *__src;
  void *__dest;
  int32_t size;
  int32_t count;
  int32_t offset;
  int32_t i;
  int32_t indexes [16];
  int32_t *inIndexes;
  uint8_t *outBytes;
  uint8_t *inBytes;
  int32_t headerSize;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if (((((*(char *)((long)inData + 0xc) == 'c') && (*(char *)((long)inData + 0xd) == 'A')) &&
            (*(char *)((long)inData + 0xe) == 'S')) && (*(char *)((long)inData + 0xf) == 'E')) &&
          ((((*(char *)((long)inData + 0x10) == '\x01' && (*(char *)((long)inData + 0x12) == '\x05')
             ) && (*(char *)((long)inData + 0x13) == '\x02')) ||
           ((1 < *(byte *)((long)inData + 0x10) && (*(byte *)((long)inData + 0x10) < 5)))))) {
    __src = (void *)((long)inData + (long)iVar2);
    __dest = (void *)((long)outData + (long)iVar2);
    outData_local._4_4_ = length;
    if ((length < 0) || (outData_local._4_4_ = length - iVar2, 0x3f < (int)outData_local._4_4_)) {
      for (count = 0; count < 0x10; count = count + 1) {
        iVar3 = udata_readInt32_63(ds,*(int32_t *)((long)__src + (long)count * 4));
        (&offset)[count] = iVar3;
      }
      if (-1 < (int)outData_local._4_4_) {
        if ((int)outData_local._4_4_ < i) {
          udata_printError_63(ds,
                              "ucase_swap(): too few bytes (%d after header) for all of case mapping data\n"
                              ,(ulong)outData_local._4_4_);
          *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        if (__src != __dest) {
          memcpy(__dest,__src,(long)i);
        }
        iVar4 = offset * 4;
        (*ds->swapArray32)(ds,__src,iVar4,__dest,pErrorCode);
        utrie_swapAnyVersion_63
                  (ds,(void *)((long)__src + (long)iVar4),indexes[0],
                   (void *)((long)__dest + (long)iVar4),pErrorCode);
        (*ds->swapArray16)(ds,(void *)((long)__src + (long)(indexes[0] + iVar4)),
                           (indexes[1] + indexes[2]) * 2,
                           (void *)((long)__dest + (long)(indexes[0] + iVar4)),pErrorCode);
      }
      ds_local._4_4_ = iVar2 + i;
    }
    else {
      udata_printError_63(ds,"ucase_swap(): too few bytes (%d after header) for case mapping data\n"
                          ,(ulong)outData_local._4_4_);
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      ds_local._4_4_ = 0;
    }
  }
  else {
    udata_printError_63(ds,
                        "ucase_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as case mapping data\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
ucase_swap(const UDataSwapper *ds,
           const void *inData, int32_t length, void *outData,
           UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const int32_t *inIndexes;
    int32_t indexes[16];

    int32_t i, offset, count, size;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==UCASE_FMT_0 &&    /* dataFormat="cAsE" */
        pInfo->dataFormat[1]==UCASE_FMT_1 &&
        pInfo->dataFormat[2]==UCASE_FMT_2 &&
        pInfo->dataFormat[3]==UCASE_FMT_3 &&
        ((pInfo->formatVersion[0]==1 &&
          pInfo->formatVersion[2]==UTRIE_SHIFT &&
          pInfo->formatVersion[3]==UTRIE_INDEX_SHIFT) ||
         (2<=pInfo->formatVersion[0] && pInfo->formatVersion[0]<=4))
    )) {
        udata_printError(ds, "ucase_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as case mapping data\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inIndexes=(const int32_t *)inBytes;

    if(length>=0) {
        length-=headerSize;
        if(length<16*4) {
            udata_printError(ds, "ucase_swap(): too few bytes (%d after header) for case mapping data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    /* read the first 16 indexes (ICU 3.2/format version 1: UCASE_IX_TOP==16, might grow) */
    for(i=0; i<16; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }

    /* get the total length of the data */
    size=indexes[UCASE_IX_LENGTH];

    if(length>=0) {
        if(length<size) {
            udata_printError(ds, "ucase_swap(): too few bytes (%d after header) for all of case mapping data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, size);
        }

        offset=0;

        /* swap the int32_t indexes[] */
        count=indexes[UCASE_IX_INDEX_TOP]*4;
        ds->swapArray32(ds, inBytes, count, outBytes, pErrorCode);
        offset+=count;

        /* swap the UTrie */
        count=indexes[UCASE_IX_TRIE_SIZE];
        utrie_swapAnyVersion(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the uint16_t exceptions[] and unfold[] */
        count=(indexes[UCASE_IX_EXC_LENGTH]+indexes[UCASE_IX_UNFOLD_LENGTH])*2;
        ds->swapArray16(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        U_ASSERT(offset==size);
    }

    return headerSize+size;
}